

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::add_blocked_sample
          (TypedTimeSamples<std::array<float,_4UL>_> *this,double t)

{
  undefined1 local_38 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<std::array<float,_4UL>_> *this_local;
  
  s._24_8_ = t;
  Sample::Sample((Sample *)local_38);
  local_38 = (undefined1  [8])s._24_8_;
  s.value._M_elems[2]._0_1_ = 1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,4ul>>::Sample>>
              *)this,(Sample *)local_38);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }